

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSetPrintLevel_SPGMR(SUNLinearSolver S,int print_level)

{
  int print_level_local;
  SUNLinearSolver S_local;
  int local_4;
  
  if (S == (SUNLinearSolver)0x0) {
    local_4 = -0x321;
  }
  else if ((print_level < 0) || (1 < print_level)) {
    local_4 = -0x322;
  }
  else {
    *(int *)((long)S->content + 0xa0) = print_level;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNLinSolSetPrintLevel_SPGMR(SUNLinearSolver S,
                                 int print_level)
{
  /* check that the linear solver is non-null */
  if (S == NULL)
    return(SUNLS_MEM_NULL);

  /* check for valid print level */
  if (print_level < 0 || print_level > 1)
    return(SUNLS_ILL_INPUT);

  SPGMR_CONTENT(S)->print_level = print_level;

  return(SUNLS_SUCCESS);
}